

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall
TestSuite::doTest<bool,int(*)(bool)>
          (TestSuite *this,string *test_name,_func_int_bool *func,TestRange<bool> *range)

{
  bool bVar1;
  int result;
  size_t sVar2;
  string *psVar3;
  size_t idx;
  string actual_test_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  bVar1 = matchFilter(this,test_name);
  if (bVar1) {
    if (this->useGivenRange == false) {
      sVar2 = TestRange<bool>::getSteps(range);
    }
    else {
      sVar2 = 1;
    }
    for (idx = 0; sVar2 != idx; idx = idx + 1) {
      std::__cxx11::string::string((string *)&actual_test_name,(string *)test_name);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      if (this->useGivenRange == true) {
        bVar1 = this->givenRange != 0;
      }
      else {
        bVar1 = TestRange<bool>::getEntry(range,idx);
      }
      std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
      std::__cxx11::stringbuf::str();
      std::operator+(&local_218," (",&local_1f8);
      std::operator+(&local_1d8,&local_218,")");
      std::__cxx11::string::append((string *)&actual_test_name);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
      readyTest(this,&actual_test_name);
      psVar3 = getResMsg_abi_cxx11_();
      std::__cxx11::string::assign((char *)psVar3);
      psVar3 = getInfoMsg_abi_cxx11_();
      std::__cxx11::string::assign((char *)psVar3);
      getCurTest()::cur_test = this;
      result = (*func)(bVar1);
      reportTestResult(this,&actual_test_name,result);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__cxx11::string::~string((string *)&actual_test_name);
    }
  }
  return;
}

Assistant:

void doTest( std::string test_name,
                 F func,
                 TestRange<T> range )
    {
        if (!matchFilter(test_name)) return;

        size_t n = (useGivenRange) ? 1 : range.getSteps();
        size_t i;

        for (i=0; i<n; ++i) {
            std::string actual_test_name = test_name;
            std::stringstream ss;


            T cur_arg = (useGivenRange)
                        ? givenRange
                        : range.getEntry(i);

            ss << cur_arg;
            actual_test_name += " (" + ss.str() + ")";
            readyTest(actual_test_name);

            TestSuite::getResMsg() = "";
            TestSuite::getInfoMsg() = "";
            TestSuite::getCurTest() = this;

            int ret = func(cur_arg);
            reportTestResult(actual_test_name, ret);
        }
    }